

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmldivs.cpp
# Opt level: O0

div_t __thiscall HtmlDivs::div(HtmlDivs *this,int __numer,int __denom)

{
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  QString *line;
  QString local_a8;
  QStringList local_90;
  undefined1 local_68 [8];
  HtmlDivs divs;
  QString *backgroundColor_local;
  QString *text_local;
  
  line = (QString *)CONCAT44(in_register_00000034,__numer);
  divs.mBackgroundColor.d.size = CONCAT44(in_register_00000014,__denom);
  HtmlDivs((HtmlDivs *)local_68);
  append((HtmlDivs *)local_68,line,(QString *)divs.mBackgroundColor.d.size);
  close((HtmlDivs *)local_68,(int)line);
  HtmlDivs::divs(&local_90,(HtmlDivs *)local_68);
  QString::QString(&local_a8,"");
  QListSpecialMethods<QString>::join
            ((QString *)this,(QListSpecialMethods<QString> *)&local_90,&local_a8);
  QString::~QString(&local_a8);
  QList<QString>::~QList(&local_90);
  ~HtmlDivs((HtmlDivs *)local_68);
  return (div_t)this;
}

Assistant:

QString HtmlDivs::div(const QString &text, const QString &backgroundColor)
{
    HtmlDivs divs;
    divs.append(text, backgroundColor);
    divs.close();
    return divs.divs().join("");
}